

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChConvexDecomposition::WriteConvexHullsAsChullsFile
          (ChConvexDecomposition *this,ChStreamOutAscii *mstream)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ChStreamOutAscii *pCVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> aconvexhull;
  void *local_58;
  void *pvStack_50;
  long local_48;
  ChConvexDecomposition *local_40;
  ulong local_38;
  
  builtin_strncpy(mstream->number_format,"%0.9f",6);
  ChStreamOutAscii::operator<<
            (mstream,
             "# Convex hulls obtained with Chrono::Engine \n# convex decomposition (.chulls format: only vertexes)\n"
            );
  iVar2 = (*this->_vptr_ChConvexDecomposition[7])(this);
  if (iVar2 != 0) {
    uVar5 = 0;
    local_40 = this;
    do {
      local_48 = 0;
      local_58 = (void *)0x0;
      pvStack_50 = (void *)0x0;
      iVar2 = (*this->_vptr_ChConvexDecomposition[9])(this,uVar5,&local_58);
      if ((char)iVar2 == '\0') {
        if (local_58 != (void *)0x0) {
          operator_delete(local_58,local_48 - (long)local_58);
        }
        return false;
      }
      ChStreamOutAscii::operator<<(mstream,"hull\n");
      local_38 = uVar5;
      if (pvStack_50 != local_58) {
        uVar5 = 0;
        uVar6 = 1;
        do {
          pCVar4 = ChStreamOutAscii::operator<<(mstream,*(double *)((long)local_58 + uVar5 * 0x18));
          pCVar4 = ChStreamOutAscii::operator<<(pCVar4," ");
          pCVar4 = ChStreamOutAscii::operator<<
                             (pCVar4,*(double *)((long)local_58 + uVar5 * 0x18 + 8));
          pCVar4 = ChStreamOutAscii::operator<<(pCVar4," ");
          pCVar4 = ChStreamOutAscii::operator<<
                             (pCVar4,*(double *)((long)local_58 + uVar5 * 0x18 + 0x10));
          ChStreamOutAscii::operator<<(pCVar4,"\n");
          uVar5 = ((long)pvStack_50 - (long)local_58 >> 3) * -0x5555555555555555;
          bVar8 = uVar6 <= uVar5;
          lVar1 = uVar5 - uVar6;
          uVar5 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar8 && lVar1 != 0);
      }
      if (local_58 != (void *)0x0) {
        operator_delete(local_58,local_48 - (long)local_58);
      }
      this = local_40;
      uVar7 = (int)local_38 + 1;
      uVar5 = (ulong)uVar7;
      uVar3 = (*local_40->_vptr_ChConvexDecomposition[7])(local_40);
    } while (uVar7 < uVar3);
  }
  return true;
}

Assistant:

bool ChConvexDecomposition::WriteConvexHullsAsChullsFile(ChStreamOutAscii& mstream) {
    mstream.SetNumFormat("%0.9f");
    mstream << "# Convex hulls obtained with Chrono::Engine \n# convex decomposition (.chulls format: only vertexes)\n";

    for (unsigned int ih = 0; ih < this->GetHullCount(); ih++) {
        std::vector<ChVector<double> > aconvexhull;

        if (!this->GetConvexHullResult(ih, aconvexhull))
            return false;

        mstream << "hull\n";
        for (unsigned int i = 0; i < aconvexhull.size(); i++) {
            mstream << aconvexhull[i].x() << " " << aconvexhull[i].y() << " " << aconvexhull[i].z() << "\n";
        }
    }
    return true;
}